

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O0

bool crnlib::prefix_coding::limit_max_code_size(uint num_syms,uint8 *pCodesizes,uint max_code_size)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  uint ofs_1;
  uint c_1;
  uint i_6;
  uint n;
  uint i_5;
  uint8 *p;
  uint8 new_codesizes [8192];
  uint local_16c;
  uint local_168;
  uint i_4;
  uint i_3;
  uint total;
  uint i_2;
  uint i_1;
  uint next_sorted_ofs [35];
  uint ofs;
  uint c;
  uint i;
  bool should_limit;
  uint num_codes [35];
  uint cMaxEverCodeSize;
  uint max_code_size_local;
  uint8 *pCodesizes_local;
  uint num_syms_local;
  
  if ((((num_syms == 0) || (0x2000 < num_syms)) || (max_code_size == 0)) || (0x22 < max_code_size))
  {
    pCodesizes_local._7_1_ = false;
  }
  else {
    utils::zero_object<unsigned_int[35]>((uint (*) [35])&i);
    bVar2 = false;
    for (ofs = 0; ofs < num_syms; ofs = ofs + 1) {
      uVar3 = (uint)pCodesizes[ofs];
      if ((uVar3 != 0) && ((&i)[uVar3] = (&i)[uVar3] + 1, max_code_size < uVar3)) {
        bVar2 = true;
      }
    }
    if (bVar2) {
      next_sorted_ofs[0x22] = 0;
      for (total = 1; total < 0x23; total = total + 1) {
        (&i_2)[total] = next_sorted_ofs[0x22];
        next_sorted_ofs[0x22] = (&i)[total] + next_sorted_ofs[0x22];
      }
      if ((next_sorted_ofs[0x22] < 2) || (0x2000 < next_sorted_ofs[0x22])) {
        pCodesizes_local._7_1_ = true;
      }
      else {
        bVar4 = (byte)max_code_size;
        if ((uint)(1 << (bVar4 & 0x1f)) < next_sorted_ofs[0x22]) {
          pCodesizes_local._7_1_ = false;
        }
        else {
          for (i_3 = max_code_size + 1; i_3 < 0x23; i_3 = i_3 + 1) {
            (&i)[max_code_size] = (&i)[i_3] + (&i)[max_code_size];
          }
          i_4 = 0;
          for (local_168 = max_code_size; local_168 != 0; local_168 = local_168 - 1) {
            i_4 = ((&i)[local_168] << (bVar4 - (char)local_168 & 0x1f)) + i_4;
          }
          if (i_4 == 1 << (bVar4 & 0x1f)) {
            pCodesizes_local._7_1_ = true;
          }
          else {
            do {
              (&i)[max_code_size] = (&i)[max_code_size] - 1;
              for (local_16c = max_code_size - 1; local_16c != 0; local_16c = local_16c - 1) {
                if ((&i)[local_16c] != 0) {
                  (&i)[local_16c] = (&i)[local_16c] - 1;
                  (&i)[local_16c + 1] = (&i)[local_16c + 1] + 2;
                  break;
                }
              }
              if (local_16c == 0) {
                return false;
              }
              i_4 = i_4 - 1;
            } while (i_4 != 1 << (bVar4 & 0x1f));
            _n = &p;
            for (i_6 = 1; i_6 <= max_code_size; i_6 = i_6 + 1) {
              uVar3 = (&i)[i_6];
              if (uVar3 != 0) {
                memset(_n,i_6 & 0xff,(ulong)uVar3);
                _n = (uint8 **)((long)_n + (ulong)uVar3);
              }
            }
            for (ofs_1 = 0; ofs_1 < num_syms; ofs_1 = ofs_1 + 1) {
              uVar3 = (uint)pCodesizes[ofs_1];
              if (uVar3 != 0) {
                uVar1 = (&i_2)[uVar3];
                (&i_2)[uVar3] = uVar1 + 1;
                pCodesizes[ofs_1] = new_codesizes[(ulong)uVar1 - 8];
              }
            }
            pCodesizes_local._7_1_ = true;
          }
        }
      }
    }
    else {
      pCodesizes_local._7_1_ = true;
    }
  }
  return pCodesizes_local._7_1_;
}

Assistant:

bool limit_max_code_size(uint num_syms, uint8* pCodesizes, uint max_code_size) {
  const uint cMaxEverCodeSize = 34;

  if ((!num_syms) || (num_syms > cMaxSupportedSyms) || (max_code_size < 1) || (max_code_size > cMaxEverCodeSize))
    return false;

  uint num_codes[cMaxEverCodeSize + 1];
  utils::zero_object(num_codes);

  bool should_limit = false;

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(c <= cMaxEverCodeSize);

      num_codes[c]++;
      if (c > max_code_size)
        should_limit = true;
    }
  }

  if (!should_limit)
    return true;

  uint ofs = 0;
  uint next_sorted_ofs[cMaxEverCodeSize + 1];
  for (uint i = 1; i <= cMaxEverCodeSize; i++) {
    next_sorted_ofs[i] = ofs;
    ofs += num_codes[i];
  }

  if ((ofs < 2) || (ofs > cMaxSupportedSyms))
    return true;

  if (ofs > (1U << max_code_size))
    return false;

  for (uint i = max_code_size + 1; i <= cMaxEverCodeSize; i++)
    num_codes[max_code_size] += num_codes[i];

  // Technique of adjusting tree to enforce maximum code size from LHArc.

  uint total = 0;
  for (uint i = max_code_size; i; --i)
    total += (num_codes[i] << (max_code_size - i));

  if (total == (1U << max_code_size))
    return true;

  do {
    num_codes[max_code_size]--;

    uint i;
    for (i = max_code_size - 1; i; --i) {
      if (!num_codes[i])
        continue;
      num_codes[i]--;
      num_codes[i + 1] += 2;
      break;
    }
    if (!i)
      return false;

    total--;
  } while (total != (1U << max_code_size));

  uint8 new_codesizes[cMaxSupportedSyms];
  uint8* p = new_codesizes;
  for (uint i = 1; i <= max_code_size; i++) {
    uint n = num_codes[i];
    if (n) {
      memset(p, i, n);
      p += n;
    }
  }

  for (uint i = 0; i < num_syms; i++) {
    const uint c = pCodesizes[i];
    if (c) {
      uint ofs = next_sorted_ofs[c];
      next_sorted_ofs[c] = ofs + 1;

      pCodesizes[i] = static_cast<uint8>(new_codesizes[ofs]);
    }
  }

  return true;
}